

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1a4cc::throwing_error_handler::error
          (throwing_error_handler *this,json_pointer *ptr,json *instance,string *message)

{
  invalid_argument *this_00;
  allocator<char> local_149;
  string_t local_148;
  string_t local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"At ",&local_149);
  nlohmann::json_abi_v3_11_2::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  to_string(&local_128,ptr);
  std::operator+(&local_e8,&local_108,&local_128);
  std::operator+(&local_c8,&local_e8," of ");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump(&local_148,instance,-1,' ',false,strict);
  std::operator+(&local_a8,&local_c8,&local_148);
  std::operator+(&local_88,&local_a8," - ");
  std::operator+(&local_68,&local_88,message);
  std::operator+(&local_48,&local_68,"\n");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void error(const json::json_pointer &ptr, const json &instance, const std::string &message) override
	{
		throw std::invalid_argument(std::string("At ") + ptr.to_string() + " of " + instance.dump() + " - " + message + "\n");
	}